

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFile(DescriptorBuilder *this,FileDescriptorProto *proto)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  Base<google::protobuf::FileDescriptorTables> *pBVar1;
  Base<google::protobuf::SourceCodeInfo> *pBVar2;
  Base<google::protobuf::FileOptions> *pBVar3;
  Base<google::protobuf::ServiceOptions> *pBVar4;
  Base<google::protobuf::MethodOptions> *pBVar5;
  int iVar6;
  pointer pbVar7;
  size_t __n;
  ulong uVar8;
  pointer pcVar9;
  PointerT<char> pcVar10;
  void *pvVar11;
  anon_union_232_1_493b367e_for_FileDescriptorProto_3 aVar12;
  FileDescriptorProto *pFVar13;
  bool bVar14;
  int iVar15;
  DescriptorPool *pDVar16;
  FileDescriptor *pFVar17;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar18;
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *this_01;
  Rep *pRVar19;
  Nonnull<const_char_*> pcVar20;
  Tables *pTVar21;
  undefined8 *puVar22;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *this_02;
  RepeatedPtrFieldBase *pRVar23;
  DescriptorPool *pDVar24;
  RepeatedPtrFieldBase *this_03;
  long lVar25;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *pRVar26;
  size_type *psVar27;
  long lVar28;
  DescriptorBuilder *this_04;
  string_view key;
  string_view element_name;
  string_view key_00;
  string_view name;
  string_view name_00;
  LogMessageFatal local_68;
  FileDescriptorProto *local_58;
  DescriptorBuilder *local_50;
  char *local_48;
  long local_40;
  void **local_38;
  
  pDVar24 = this->pool_;
  pDVar16 = DescriptorPool::internal_generated_pool();
  if (pDVar24 != pDVar16) {
    DescriptorPool::internal_generated_pool();
    DescriptorProto::GetMetadata((DescriptorProto *)_DescriptorProto_default_instance_);
    pb::CppFeatures::GetMetadata((CppFeatures *)pb::_CppFeatures_default_instance_);
  }
  std::__cxx11::string::_M_assign((string *)&this->filename_);
  key._M_str = (this->filename_)._M_dataplus._M_p;
  key._M_len = (this->filename_)._M_string_length;
  pFVar17 = DescriptorPool::Tables::FindFile(this->tables_,key);
  if ((pFVar17 == (FileDescriptor *)0x0) ||
     (bVar14 = ExistingFileMatchesProto(pFVar17->edition_,pFVar17,proto), !bVar14)) {
    pTVar21 = this->tables_;
    pbVar7 = (pTVar21->pending_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar28 = (long)(pTVar21->pending_files_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7;
    local_58 = proto;
    local_50 = this;
    if (lVar28 != 0) {
      lVar28 = lVar28 >> 5;
      puVar22 = (undefined8 *)
                ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      __n = puVar22[1];
      psVar27 = &pbVar7->_M_string_length;
      lVar25 = 0;
      do {
        if ((*psVar27 == __n) &&
           ((__n == 0 ||
            (iVar15 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (psVar27 + -1))->_M_dataplus)._M_p,(void *)*puVar22,__n), iVar15 == 0)))
           ) {
          AddRecursiveImportError(local_50,local_58,(int)lVar25);
          return (FileDescriptor *)0x0;
        }
        lVar25 = lVar25 + 1;
        psVar27 = psVar27 + 4;
      } while (lVar28 + (ulong)(lVar28 == 0) != lVar25);
    }
    this_04 = local_50;
    pFVar13 = local_58;
    puVar22 = (undefined8 *)
              ((ulong)(local_58->field_0)._impl_.package_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    uVar8 = puVar22[1];
    if (0x1ff < uVar8) {
      element_name._M_str = (char *)*puVar22;
      element_name._M_len = uVar8;
      AddError(local_50,element_name,&local_58->super_Message,NAME,"Package name is too long");
      return (FileDescriptor *)0x0;
    }
    if ((local_50->pool_->lazily_build_dependencies_ == false) &&
       (local_50->pool_->fallback_database_ != (DescriptorDatabase *)0x0)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&pTVar21->pending_files_,
                  (value_type *)
                  ((ulong)(local_58->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
      if (0 < *(int *)((long)&pFVar13->field_0 + 0x10)) {
        this_00 = &(local_58->field_0)._impl_.dependency_;
        iVar15 = 0;
        do {
          pTVar21 = this_04->tables_;
          pVVar18 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                              (&this_00->super_RepeatedPtrFieldBase,iVar15);
          key_00._M_str = (pVVar18->_M_dataplus)._M_p;
          key_00._M_len = pVVar18->_M_string_length;
          pFVar17 = DescriptorPool::Tables::FindFile(pTVar21,key_00);
          if (pFVar17 == (FileDescriptor *)0x0) {
            pDVar24 = this_04->pool_;
            pDVar16 = pDVar24->underlay_;
            if (pDVar16 != (DescriptorPool *)0x0) {
              pVVar18 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                  (&this_00->super_RepeatedPtrFieldBase,iVar15);
              name._M_str = (pVVar18->_M_dataplus)._M_p;
              name._M_len = pVVar18->_M_string_length;
              pFVar17 = DescriptorPool::FindFileByName(pDVar16,name);
              if (pFVar17 != (FileDescriptor *)0x0) goto LAB_002170c7;
              pDVar24 = this_04->pool_;
            }
            pVVar18 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                (&this_00->super_RepeatedPtrFieldBase,iVar15);
            name_00._M_str = (pVVar18->_M_dataplus)._M_p;
            name_00._M_len = pVVar18->_M_string_length;
            DescriptorPool::TryFindFileInFallbackDatabase
                      (pDVar24,name_00,this_04->deferred_validation_);
          }
LAB_002170c7:
          iVar15 = iVar15 + 1;
        } while (iVar15 < *(int *)((long)&local_58->field_0 + 0x10));
      }
      pTVar21 = this_04->tables_;
      pbVar7 = (pTVar21->pending_files_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (pTVar21->pending_files_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar7 + -1;
      pcVar9 = pbVar7[-1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar9 != &pbVar7[-1].field_2) {
        operator_delete(pcVar9,pbVar7[-1].field_2._M_allocated_capacity + 1);
        pTVar21 = this_04->tables_;
      }
    }
    local_68.super_LogMessage._0_8_ = pTVar21;
    std::
    vector<google::protobuf::DescriptorPool::Tables::CheckPoint,std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>>
    ::emplace_back<google::protobuf::DescriptorPool::Tables*>
              ((vector<google::protobuf::DescriptorPool::Tables::CheckPoint,std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>>
                *)&pTVar21->checkpoints_,(Tables **)&local_68);
    this_01 = (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               *)operator_new(0xe0);
    iVar15 = 0;
    memset(this_01,0,0xe0);
    anon_unknown_24::
    FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ::PlanArray<google::protobuf::FileDescriptor>(this_01,iVar15);
    if ((this_01->pointers_).payload_.super_Base<char>.value != (PointerT<char>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                 ,0x19b,"!has_allocated()");
      goto LAB_002175f6;
    }
    pBVar1 = &(this_01->total_).payload_.super_Base<google::protobuf::FileDescriptorTables>;
    pBVar1->value = pBVar1->value + 1;
    protobuf::(anonymous_namespace)::
    FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
    ::PlanArray<std::__cxx11::string>
              ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                *)this_01,2);
    aVar12 = local_58->field_0;
    local_48 = "!value || _impl_.options_ != nullptr";
    if ((((undefined1  [232])aVar12 & (undefined1  [232])0x8) != (undefined1  [232])0x0) &&
       ((local_58->field_0)._impl_.options_ == (FileOptions *)0x0)) {
      iVar15 = 0x3381;
LAB_00217697:
      internal::protobuf_assumption_failed
                (local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                 ,iVar15);
    }
    if (((undefined1  [232])aVar12 & (undefined1  [232])0x8) != (undefined1  [232])0x0) {
      if ((this_01->pointers_).payload_.super_Base<char>.value != (PointerT<char>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_68,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x19b,"!has_allocated()");
        goto LAB_002175f6;
      }
      pBVar3 = &(this_01->total_).payload_.super_Base<google::protobuf::FileOptions>;
      pBVar3->value = pBVar3->value + 1;
    }
    if ((((undefined1  [232])aVar12 & (undefined1  [232])0x10) != (undefined1  [232])0x0) &&
       ((local_58->field_0)._impl_.source_code_info_ == (SourceCodeInfo *)0x0)) {
      iVar15 = 0x33e3;
      local_48 = "!value || _impl_.source_code_info_ != nullptr";
      goto LAB_00217697;
    }
    pcVar10 = (this_01->pointers_).payload_.super_Base<char>.value;
    if (((undefined1  [232])aVar12 & (undefined1  [232])0x10) == (undefined1  [232])0x0) {
      if (pcVar10 != (PointerT<char>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_68,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x19b,"!has_allocated()");
        goto LAB_002175f6;
      }
    }
    else {
      if (pcVar10 != (PointerT<char>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_68,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x19b,"!has_allocated()");
        goto LAB_002175f6;
      }
      pBVar2 = &(this_01->total_).payload_.super_Base<google::protobuf::SourceCodeInfo>;
      pBVar2->value = pBVar2->value + 1;
    }
    lVar28 = *(long *)(((ulong)(local_58->field_0)._impl_.package_.tagged_ptr_.ptr_ &
                       0xfffffffffffffffc) + 8);
    (this_01->total_).payload_.super_Base<char>.value =
         (this_01->total_).payload_.super_Base<char>.value +
         *(int *)((long)&local_58->field_0 + 0x58) * 0x40;
    this_02 = &(local_58->field_0)._impl_.service_;
    pRVar26 = this_02;
    if ((*(byte *)((long)&local_58->field_0 + 0x50) & 1) != 0) {
      pRVar19 = internal::RepeatedPtrFieldBase::rep(&this_02->super_RepeatedPtrFieldBase);
      pRVar26 = (RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)pRVar19->elements;
      if (((ulong)(this_02->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
        pRVar19 = internal::RepeatedPtrFieldBase::rep(&this_02->super_RepeatedPtrFieldBase);
        this_02 = (RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)pRVar19->elements;
      }
    }
    local_38 = &(this_02->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
               *(int *)((long)&local_58->field_0 + 0x58);
    if (pRVar26 != (RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)local_38) {
      local_40 = lVar28 + 1;
      if (lVar28 == 0) {
        local_40 = 0;
      }
      do {
        pvVar11 = (pRVar26->super_RepeatedPtrFieldBase).tagged_rep_or_elem_;
        if (((*(uint *)((long)pvVar11 + 0x10) & 2) != 0) && (*(long *)((long)pvVar11 + 0x38) == 0))
        {
          iVar15 = 0x3f9e;
          goto LAB_00217697;
        }
        if ((*(uint *)((long)pvVar11 + 0x10) & 2) != 0) {
          if ((this_01->pointers_).payload_.super_Base<char>.value != (PointerT<char>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      (&local_68,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                       ,0x19b,"!has_allocated()");
            goto LAB_002175f6;
          }
          pBVar4 = &(this_01->total_).payload_.super_Base<google::protobuf::ServiceOptions>;
          pBVar4->value = pBVar4->value + 1;
        }
        iVar15 = (int)*(undefined8 *)((*(ulong *)((long)pvVar11 + 0x30) & 0xfffffffffffffffc) + 8) +
                 (int)local_40;
        anon_unknown_24::
        FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
        ::PlanArray<char>(this_01,iVar15 + 5);
        if ((this_01->pointers_).payload_.super_Base<char>.value != (PointerT<char>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    (&local_68,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                     ,0x19b,"!has_allocated()");
          goto LAB_002175f6;
        }
        (this_01->total_).payload_.super_Base<char>.value =
             (this_01->total_).payload_.super_Base<char>.value +
             *(int *)((long)pvVar11 + 0x20) * 0x50;
        this_03 = (RepeatedPtrFieldBase *)((long)pvVar11 + 0x18);
        pRVar23 = this_03;
        if ((*(byte *)((long)pvVar11 + 0x18) & 1) != 0) {
          pRVar19 = internal::RepeatedPtrFieldBase::rep(this_03);
          pRVar23 = (RepeatedPtrFieldBase *)pRVar19->elements;
          if (((ulong)this_03->tagged_rep_or_elem_ & 1) != 0) {
            pRVar19 = internal::RepeatedPtrFieldBase::rep(this_03);
            this_03 = (RepeatedPtrFieldBase *)pRVar19->elements;
          }
        }
        iVar6 = *(int *)((long)pvVar11 + 0x20);
        this_04 = local_50;
        for (; local_50 = this_04,
            pRVar23 != (RepeatedPtrFieldBase *)(&this_03->tagged_rep_or_elem_ + iVar6);
            pRVar23 = (RepeatedPtrFieldBase *)&pRVar23->current_size_) {
          pvVar11 = pRVar23->tagged_rep_or_elem_;
          anon_unknown_24::
          FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
          ::PlanArray<char>(this_01,iVar15 + *(int *)((*(ulong *)((long)pvVar11 + 0x18) &
                                                      0xfffffffffffffffc) + 8) + 6);
          if (((*(uint *)((long)pvVar11 + 0x10) & 8) != 0) && (*(long *)((long)pvVar11 + 0x30) == 0)
             ) {
            iVar15 = 0x40d3;
            goto LAB_00217697;
          }
          if ((*(uint *)((long)pvVar11 + 0x10) & 8) != 0) {
            if ((this_01->pointers_).payload_.super_Base<char>.value != (PointerT<char>)0x0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        (&local_68,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                         ,0x19b,"!has_allocated()");
              goto LAB_002175f6;
            }
            pBVar5 = &(this_01->total_).payload_.super_Base<google::protobuf::MethodOptions>;
            pBVar5->value = pBVar5->value + 1;
          }
          this_04 = local_50;
        }
        pRVar26 = (RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)
                  &(pRVar26->super_RepeatedPtrFieldBase).current_size_;
      } while (pRVar26 != (RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)local_38);
    }
    PlanAllocationSize(&(local_58->field_0)._impl_.message_type_,
                       *(size_t *)
                        (((ulong)(local_58->field_0)._impl_.package_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8),(FlatAllocator *)this_01);
    PlanAllocationSize(&(local_58->field_0)._impl_.enum_type_,
                       *(size_t *)
                        (((ulong)(local_58->field_0)._impl_.package_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8),(FlatAllocator *)this_01);
    PlanAllocationSize(&(local_58->field_0)._impl_.extension_,
                       *(size_t *)
                        (((ulong)(local_58->field_0)._impl_.package_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8),(FlatAllocator *)this_01);
    iVar15 = internal::SooRep::size
                       (&(local_58->field_0)._impl_.weak_dependency_.soo_rep_,
                        (*(byte *)((long)&local_58->field_0 + 0x90) & 4) == 0);
    anon_unknown_24::
    FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ::PlanArray<int>(this_01,iVar15);
    iVar15 = internal::SooRep::size
                       (&(local_58->field_0)._impl_.public_dependency_.soo_rep_,
                        (*(byte *)((long)&local_58->field_0 + 0x80) & 4) == 0);
    anon_unknown_24::
    FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ::PlanArray<int>(this_01,iVar15);
    if ((this_01->pointers_).payload_.super_Base<char>.value != (PointerT<char>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                 ,0x19b,"!has_allocated()");
      goto LAB_002175f6;
    }
    (this_01->total_).payload_.super_Base<char>.value =
         (this_01->total_).payload_.super_Base<char>.value +
         *(int *)((long)&local_58->field_0 + 0x10) * 8;
    protobuf::(anonymous_namespace)::
    FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
    ::FinalizePlanning<google::protobuf::DescriptorPool::Tables*>
              ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                *)this_01,(Tables **)this_04->tables_);
    pFVar17 = BuildFileImpl(this_04,local_58,(FlatAllocator *)this_01);
    if (pFVar17 == (FileDescriptor *)0x0) {
      DescriptorPool::Tables::RollbackToLastCheckpoint
                (this_04->tables_,this_04->deferred_validation_);
    }
    else {
      DescriptorPool::Tables::ClearLastCheckpoint(this_04->tables_);
      pFVar17->finished_building_ = true;
      iVar15 = (this_01->total_).payload_.super_Base<char>.value;
      iVar6 = (this_01->used_).payload_.super_Base<char>.value;
      if (iVar15 != iVar6) {
        pcVar20 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)iVar15,(long)iVar6,
                             "total_.template Get<U>() == used_.template Get<U>()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_68,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x286,pcVar20);
LAB_002175f6:
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_68);
      }
      iVar15 = (this_01->total_).payload_.
               super_Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .value;
      iVar6 = (this_01->used_).payload_.
              super_Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .value;
      if (iVar15 != iVar6) {
        pcVar20 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)iVar15,(long)iVar6,
                             "total_.template Get<U>() == used_.template Get<U>()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_68,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x286,pcVar20);
        goto LAB_002175f6;
      }
      iVar15 = (this_01->total_).payload_.super_Base<google::protobuf::SourceCodeInfo>.value;
      iVar6 = (this_01->used_).payload_.super_Base<google::protobuf::SourceCodeInfo>.value;
      if (iVar15 != iVar6) {
        pcVar20 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)iVar15,(long)iVar6,
                             "total_.template Get<U>() == used_.template Get<U>()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_68,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x286,pcVar20);
        goto LAB_002175f6;
      }
      iVar15 = (this_01->total_).payload_.super_Base<google::protobuf::FileDescriptorTables>.value;
      iVar6 = (this_01->used_).payload_.super_Base<google::protobuf::FileDescriptorTables>.value;
      if (iVar15 != iVar6) {
        pcVar20 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)iVar15,(long)iVar6,
                             "total_.template Get<U>() == used_.template Get<U>()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_68,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x286,pcVar20);
        goto LAB_002175f6;
      }
      iVar15 = (this_01->total_).payload_.super_Base<google::protobuf::FeatureSet>.value;
      iVar6 = (this_01->used_).payload_.super_Base<google::protobuf::FeatureSet>.value;
      if (iVar15 != iVar6) {
        pcVar20 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)iVar15,(long)iVar6,
                             "total_.template Get<U>() == used_.template Get<U>()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_68,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x286,pcVar20);
        goto LAB_002175f6;
      }
      iVar15 = (this_01->total_).payload_.super_Base<google::protobuf::MessageOptions>.value;
      iVar6 = (this_01->used_).payload_.super_Base<google::protobuf::MessageOptions>.value;
      if (iVar15 != iVar6) {
        pcVar20 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)iVar15,(long)iVar6,
                             "total_.template Get<U>() == used_.template Get<U>()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_68,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x286,pcVar20);
        goto LAB_002175f6;
      }
      iVar15 = (this_01->total_).payload_.super_Base<google::protobuf::FieldOptions>.value;
      iVar6 = (this_01->used_).payload_.super_Base<google::protobuf::FieldOptions>.value;
      if (iVar15 != iVar6) {
        pcVar20 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)iVar15,(long)iVar6,
                             "total_.template Get<U>() == used_.template Get<U>()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_68,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x286,pcVar20);
        goto LAB_002175f6;
      }
      iVar15 = (this_01->total_).payload_.super_Base<google::protobuf::EnumOptions>.value;
      iVar6 = (this_01->used_).payload_.super_Base<google::protobuf::EnumOptions>.value;
      if (iVar15 != iVar6) {
        pcVar20 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)iVar15,(long)iVar6,
                             "total_.template Get<U>() == used_.template Get<U>()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_68,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x286,pcVar20);
        goto LAB_002175f6;
      }
      iVar15 = (this_01->total_).payload_.super_Base<google::protobuf::EnumValueOptions>.value;
      iVar6 = (this_01->used_).payload_.super_Base<google::protobuf::EnumValueOptions>.value;
      if (iVar15 != iVar6) {
        pcVar20 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)iVar15,(long)iVar6,
                             "total_.template Get<U>() == used_.template Get<U>()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_68,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x286,pcVar20);
        goto LAB_002175f6;
      }
      iVar15 = (this_01->total_).payload_.super_Base<google::protobuf::ExtensionRangeOptions>.value;
      iVar6 = (this_01->used_).payload_.super_Base<google::protobuf::ExtensionRangeOptions>.value;
      if (iVar15 != iVar6) {
        pcVar20 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)iVar15,(long)iVar6,
                             "total_.template Get<U>() == used_.template Get<U>()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_68,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x286,pcVar20);
        goto LAB_002175f6;
      }
      iVar15 = (this_01->total_).payload_.super_Base<google::protobuf::OneofOptions>.value;
      iVar6 = (this_01->used_).payload_.super_Base<google::protobuf::OneofOptions>.value;
      if (iVar15 != iVar6) {
        pcVar20 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)iVar15,(long)iVar6,
                             "total_.template Get<U>() == used_.template Get<U>()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_68,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x286,pcVar20);
        goto LAB_002175f6;
      }
      iVar15 = (this_01->total_).payload_.super_Base<google::protobuf::ServiceOptions>.value;
      iVar6 = (this_01->used_).payload_.super_Base<google::protobuf::ServiceOptions>.value;
      if (iVar15 != iVar6) {
        pcVar20 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)iVar15,(long)iVar6,
                             "total_.template Get<U>() == used_.template Get<U>()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_68,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x286,pcVar20);
        goto LAB_002175f6;
      }
      iVar15 = (this_01->total_).payload_.super_Base<google::protobuf::MethodOptions>.value;
      iVar6 = (this_01->used_).payload_.super_Base<google::protobuf::MethodOptions>.value;
      if (iVar15 != iVar6) {
        pcVar20 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)iVar15,(long)iVar6,
                             "total_.template Get<U>() == used_.template Get<U>()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_68,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x286,pcVar20);
        goto LAB_002175f6;
      }
      iVar15 = (this_01->total_).payload_.super_Base<google::protobuf::FileOptions>.value;
      iVar6 = (this_01->used_).payload_.super_Base<google::protobuf::FileOptions>.value;
      if (iVar15 != iVar6) {
        pcVar20 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)iVar15,(long)iVar6,
                             "total_.template Get<U>() == used_.template Get<U>()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_68,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x286,pcVar20);
        goto LAB_002175f6;
      }
    }
    operator_delete(this_01,0xe0);
  }
  return pFVar17;
}

Assistant:

const FileDescriptor* DescriptorBuilder::BuildFile(
    const FileDescriptorProto& proto) {
  // Ensure the generated pool has been lazily initialized.  This is most
  // important for protos that use C++-specific features, since that extension
  // is only registered lazily and we always parse options into the generated
  // pool.
  if (pool_ != DescriptorPool::internal_generated_pool()) {
    DescriptorPool::generated_pool();
  }

  filename_ = proto.name();

  // Check if the file already exists and is identical to the one being built.
  // Note:  This only works if the input is canonical -- that is, it
  //   fully-qualifies all type names, has no UninterpretedOptions, etc.
  //   This is fine, because this idempotency "feature" really only exists to
  //   accommodate one hack in the proto1->proto2 migration layer.
  const FileDescriptor* existing_file = tables_->FindFile(filename_);
  if (existing_file != nullptr) {
    // File already in pool.  Compare the existing one to the input.
    if (ExistingFileMatchesProto(existing_file->edition(), existing_file,
                                 proto)) {
      // They're identical.  Return the existing descriptor.
      return existing_file;
    }

    // Not a match.  The error will be detected and handled later.
  }

  // Check to see if this file is already on the pending files list.
  // TODO:  Allow recursive imports?  It may not work with some
  //   (most?) programming languages.  E.g., in C++, a forward declaration
  //   of a type is not sufficient to allow it to be used even in a
  //   generated header file due to inlining.  This could perhaps be
  //   worked around using tricks involving inserting #include statements
  //   mid-file, but that's pretty ugly, and I'm pretty sure there are
  //   some languages out there that do not allow recursive dependencies
  //   at all.
  for (size_t i = 0; i < tables_->pending_files_.size(); i++) {
    if (tables_->pending_files_[i] == proto.name()) {
      AddRecursiveImportError(proto, i);
      return nullptr;
    }
  }

  static const int kMaximumPackageLength = 511;
  if (proto.package().size() > kMaximumPackageLength) {
    AddError(proto.package(), proto, DescriptorPool::ErrorCollector::NAME,
             "Package name is too long");
    return nullptr;
  }

  // If we have a fallback_database_, and we aren't doing lazy import building,
  // attempt to load all dependencies now, before checkpointing tables_.  This
  // avoids confusion with recursive checkpoints.
  if (!pool_->lazily_build_dependencies_) {
    if (pool_->fallback_database_ != nullptr) {
      tables_->pending_files_.push_back(proto.name());
      for (int i = 0; i < proto.dependency_size(); i++) {
        if (tables_->FindFile(proto.dependency(i)) == nullptr &&
            (pool_->underlay_ == nullptr ||
             pool_->underlay_->FindFileByName(proto.dependency(i)) ==
                 nullptr)) {
          // We don't care what this returns since we'll find out below anyway.
          pool_->TryFindFileInFallbackDatabase(proto.dependency(i),
                                               deferred_validation_);
        }
      }
      tables_->pending_files_.pop_back();
    }
  }

  // Checkpoint the tables so that we can roll back if something goes wrong.
  tables_->AddCheckpoint();

  auto alloc = absl::make_unique<internal::FlatAllocator>();
  PlanAllocationSize(proto, *alloc);
  alloc->FinalizePlanning(tables_);
  FileDescriptor* result = BuildFileImpl(proto, *alloc);

  file_tables_->FinalizeTables();
  if (result) {
    tables_->ClearLastCheckpoint();
    result->finished_building_ = true;
    alloc->ExpectConsumed();
  } else {
    tables_->RollbackToLastCheckpoint(deferred_validation_);
  }

  return result;
}